

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall
cmFileListGeneratorGlob::cmFileListGeneratorGlob
          (cmFileListGeneratorGlob *this,cmFileListGeneratorGlob *r)

{
  (this->super_cmFileListGeneratorBase).Next.x_ = (cmFileListGeneratorBase *)0x0;
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorGlob_00646f40;
  std::__cxx11::string::string((string *)&this->Pattern,(string *)&r->Pattern);
  return;
}

Assistant:

cmFileListGeneratorGlob(cmFileListGeneratorGlob const& r)
    : cmFileListGeneratorBase()
    , Pattern(r.Pattern)
  {
  }